

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O3

double r8_hyper_2f1(double a,double b,double c,double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ostream *poVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double local_128;
  double local_a0;
  double local_38;
  
  if (c < 0.0) {
    if (((double)(int)c == c) && (!NAN((double)(int)c) && !NAN(c))) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"R8_HYPER_2F1 - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  The hypergeometric series is divergent.\n");
      std::operator<<((ostream *)&std::cerr,"  C is integral and negative.\n");
      poVar8 = std::operator<<((ostream *)&std::cerr,"  C = ");
      x = c;
      goto LAB_001cc73f;
    }
  }
  dVar23 = 1.0 - x;
  dVar18 = c - a;
  dVar25 = dVar18 - b;
  if ((dVar23 < 1e-15) && (dVar25 <= 0.0)) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"R8_HYPER_2F1 - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  The hypergeometric series is divergent.\n");
    std::operator<<((ostream *)&std::cerr,"  1 - X < 0, C - A - B <= 0\n");
    poVar8 = std::operator<<((ostream *)&std::cerr,"  A = ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,a);
    std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<((ostream *)&std::cerr,"  B = ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,b);
    std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<((ostream *)&std::cerr,"  C = ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,c);
    std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<((ostream *)&std::cerr,"  X = ");
LAB_001cc73f:
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,x);
    std::operator<<(poVar8,"\n");
    exit(1);
  }
  if ((b == 0.0) && (!NAN(b))) {
    return 1.0;
  }
  if ((a == 0.0) && (!NAN(a))) {
    return 1.0;
  }
  if ((x == 0.0) && (!NAN(x))) {
    return 1.0;
  }
  dVar26 = c - b;
  dVar22 = *(double *)(&DAT_00225a90 + (ulong)(0.95 < x) * 8);
  if (((0.0 < dVar25) && (dVar23 == dVar22)) && (!NAN(dVar23) && !NAN(dVar22))) {
    dVar22 = tgamma(c);
    dVar23 = tgamma(dVar25);
    dVar25 = tgamma(dVar18);
    dVar18 = tgamma(dVar26);
    dVar23 = dVar23 * dVar22;
    dVar18 = dVar18 * dVar25;
LAB_001cb4a0:
    return dVar23 / dVar18;
  }
  if ((x + 1.0 <= dVar22) && (ABS(dVar18 + b + -1.0) <= dVar22)) {
    dVar25 = exp2(-a);
    dVar23 = tgamma(c);
    dVar22 = tgamma((a * 0.5 + 1.0) - b);
    dVar18 = tgamma(a * 0.5 + 0.5);
    dVar23 = dVar23 * dVar25 * 1.7724538509055159;
    dVar18 = dVar18 * dVar22;
    goto LAB_001cb4a0;
  }
  if ((double)(int)a == a && a < 0.0 || (double)(int)b == b && 0.0 > b) {
    dVar18 = ABS(b);
    if ((double)(int)b != b || 0.0 <= b) {
      dVar18 = ABS(a);
    }
    iVar5 = (int)dVar18;
    if (iVar5 < 1) {
      return 1.0;
    }
    dVar18 = 1.0;
    dVar23 = 1.0;
    dVar25 = 1.0;
    do {
      dVar18 = (((dVar23 + b + -1.0) * (dVar23 + a + -1.0) * dVar18) /
               ((dVar23 + c + -1.0) * dVar23)) * x;
      dVar25 = dVar25 + dVar18;
      dVar23 = dVar23 + 1.0;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    return dVar25;
  }
  if (dVar18 <= 0.0 && (double)(int)dVar18 == dVar18 ||
      0.0 >= dVar26 && (double)(int)dVar26 == dVar26) {
    dVar22 = dVar26;
    if (0.0 < dVar26 || (double)(int)dVar26 != dVar26) {
      dVar22 = dVar18;
    }
    iVar5 = (int)ABS(dVar22);
    if (iVar5 < 1) {
      dVar22 = 1.0;
    }
    else {
      dVar19 = 1.0;
      dVar17 = 1.0;
      dVar22 = 1.0;
      do {
        dVar19 = (((dVar26 + dVar17 + -1.0) * (dVar18 + dVar17 + -1.0) * dVar19) /
                 ((dVar17 + c + -1.0) * dVar17)) * x;
        dVar22 = dVar22 + dVar19;
        dVar17 = dVar17 + 1.0;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    dVar18 = pow(dVar23,dVar25);
    return dVar18 * dVar22;
  }
  dVar25 = x;
  dVar19 = b;
  if (((0.0 <= x) || (dVar25 = x / (x + -1.0), dVar19 = dVar26, c <= a)) || ((a <= b || (b <= 0.0)))
     ) {
    dVar18 = dVar19;
    b = a;
  }
  if (dVar25 < 0.75) {
    if ((((dVar18 + dVar18 <= c) || (c <= dVar18)) || (c <= b)) || (b + b <= c)) {
      dVar26 = 1.0;
    }
    else {
      b = c - b;
      dVar26 = pow(1.0 - dVar25,b - dVar18);
      dVar18 = c - dVar18;
    }
    dVar17 = 1.0;
    uVar13 = 1;
    dVar19 = 1.0;
    do {
      dVar21 = (double)(int)uVar13;
      dVar17 = (((dVar18 + dVar21 + -1.0) * (b + dVar21 + -1.0) * dVar17) /
               ((dVar21 + c + -1.0) * dVar21)) * dVar25;
      dVar21 = dVar19 + dVar17;
      if (ABS(dVar21 - dVar19) <= ABS(dVar21) * dVar22) goto LAB_001cbd17;
      uVar13 = uVar13 + 1;
      dVar19 = dVar21;
    } while (uVar13 != 0xfb);
    uVar13 = 0xfb;
LAB_001cbd17:
    dVar26 = dVar26 * dVar21;
    goto LAB_001cc527;
  }
  dVar2 = c - b;
  dVar16 = dVar2 - dVar18;
  dVar26 = (double)(int)dVar16;
  dVar19 = tgamma(b);
  dVar17 = tgamma(dVar18);
  dVar21 = tgamma(c);
  if (1e-15 <= ABS(dVar16 - dVar26)) {
    dVar26 = tgamma(dVar2);
    dVar1 = tgamma(c - dVar18);
    dVar20 = tgamma(dVar16);
    dVar3 = (dVar18 + b) - c;
    dVar24 = tgamma(dVar3);
    dVar1 = (dVar20 * dVar21) / (dVar1 * dVar26);
    dVar25 = 1.0 - dVar25;
    dVar26 = pow(dVar25,dVar16);
    dVar26 = dVar26 * ((dVar24 * dVar21) / (dVar19 * dVar17));
    uVar13 = 1;
    dVar21 = dVar26;
    dVar19 = dVar1;
    dVar17 = 0.0;
    do {
      dVar20 = (double)(int)uVar13;
      dVar19 = (((dVar18 + dVar20 + -1.0) * (b + dVar20 + -1.0) * dVar19) /
               ((dVar3 + dVar20) * dVar20)) * dVar25;
      dVar21 = ((((c - dVar18) + dVar20 + -1.0) * (dVar2 + dVar20 + -1.0) * dVar21) /
               ((dVar16 + dVar20) * dVar20)) * dVar25;
      dVar20 = dVar17 + dVar19 + dVar21;
      if (ABS(dVar20 - dVar17) < ABS(dVar20) * dVar22) goto LAB_001cbc4c;
      uVar13 = uVar13 + 1;
      dVar17 = dVar20;
    } while (uVar13 != 0xfb);
    uVar13 = 0xfb;
LAB_001cbc4c:
    dVar26 = dVar26 + dVar1 + dVar20;
    goto LAB_001cc527;
  }
  uVar10 = (uint)dVar16;
  dVar2 = tgamma(b + dVar26);
  dVar16 = tgamma(dVar18 + dVar26);
  dVar1 = r8_psi(b);
  dVar20 = r8_psi(dVar18);
  uVar13 = 0;
  if (uVar10 != 0) {
    uVar13 = 0x3ff00000;
  }
  dVar3 = (double)((ulong)uVar13 << 0x20);
  uVar12 = -uVar10;
  uVar6 = uVar10;
  if ((int)uVar10 < 1) {
    uVar6 = uVar12;
  }
  if (1 < uVar6) {
    iVar5 = uVar6 - 1;
    dVar24 = 1.0;
    dVar3 = (double)((ulong)uVar13 << 0x20);
    do {
      dVar3 = dVar3 * dVar24;
      dVar24 = dVar24 + 1.0;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  if (uVar10 == 0) {
    local_128 = 1.0;
LAB_001cbd3e:
    local_38 = -dVar21;
    dVar24 = pow(dVar25 + -1.0,dVar26);
    dVar24 = dVar24 * local_38;
    if (uVar10 < 2) {
      local_38 = 1.0;
      if (uVar10 != 0) goto LAB_001cbe53;
      local_38 = 1.0;
      dVar14 = 0.0;
      iVar5 = 2;
    }
    else {
      dVar15 = 1.0;
      uVar13 = 1;
      dVar14 = 1.0;
      local_38 = 1.0;
      do {
        dVar14 = (((dVar18 + dVar15 + -1.0) * (b + dVar15 + -1.0) * dVar14) /
                 (double)(int)((uVar12 + uVar13) * uVar13)) * (1.0 - dVar25);
        local_38 = local_38 + dVar14;
        dVar15 = dVar15 + 1.0;
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar10);
LAB_001cbe53:
      iVar5 = uVar10 + 1;
      dVar15 = 1.0;
      dVar14 = 0.0;
      uVar13 = uVar10;
      do {
        dVar14 = -1.0 / dVar15 + 1.0 / (dVar18 + dVar15 + -1.0) + 1.0 / (b + dVar15 + -1.0) + dVar14
        ;
        dVar15 = dVar15 + 1.0;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    local_a0 = (dVar3 * dVar21) / (dVar2 * dVar16);
    dVar24 = dVar24 / (dVar19 * dVar17 * local_128);
    dVar25 = 1.0 - dVar25;
    dVar19 = log(dVar25);
    uVar13 = 1;
    dVar21 = 0.0;
    iVar11 = 2;
    dVar17 = 1.0;
    dVar19 = dVar19 + dVar14 + dVar1 + dVar20 + 1.1544313298030657;
    do {
      dVar16 = (double)(int)uVar13;
      dVar2 = 0.0;
      if (uVar10 != 0) {
        dVar3 = 1.0;
        iVar9 = iVar5 + -1;
        iVar7 = iVar11;
        dVar2 = 0.0;
        do {
          dVar2 = 1.0 / (dVar18 + dVar3 + dVar16 + -1.0) +
                  (1.0 - b) / ((b + dVar3 + dVar16 + -1.0) * (double)iVar7) + dVar2;
          dVar3 = dVar3 + 1.0;
          iVar7 = iVar7 + 1;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      dVar21 = (1.0 - dVar18) / ((dVar18 + dVar16 + -1.0) * dVar16) +
               dVar21 + (1.0 - b) / ((b + dVar16 + -1.0) * dVar16);
      dVar3 = log(dVar25);
      dVar17 = (((dVar16 + dVar18 + dVar26 + -1.0) * dVar17 * (b + dVar26 + dVar16 + -1.0)) /
               (double)(int)((uVar13 + uVar10) * uVar13)) * dVar25;
      dVar2 = (dVar3 + dVar1 + dVar20 + 1.1544313298030657 + dVar21 + dVar2) * dVar17 + dVar19;
      if (ABS(dVar2 - dVar19) < ABS(dVar2) * dVar22) goto LAB_001cc4f6;
      uVar13 = uVar13 + 1;
      iVar11 = iVar11 + 1;
      dVar19 = dVar2;
    } while (uVar13 != 0xfb);
    uVar13 = 0xfb;
  }
  else {
    dVar24 = 1.0;
    local_128 = 1.0;
    do {
      local_128 = local_128 * dVar24;
      dVar24 = dVar24 + 1.0;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
    if (-1 < (int)uVar10) goto LAB_001cbd3e;
    dVar25 = 1.0 - dVar25;
    dVar14 = (double)(int)uVar12;
    dVar26 = pow(dVar25,dVar14);
    dVar24 = pow(-1.0,dVar14);
    local_38 = 1.0;
    if (uVar10 != 0xffffffff) {
      iVar5 = 1;
      dVar4 = 1.0;
      dVar15 = 1.0;
      local_38 = 1.0;
      do {
        dVar15 = ((((dVar18 - dVar14) + dVar4 + -1.0) * ((b - dVar14) + dVar4 + -1.0) * dVar15) /
                 (double)(int)((uVar10 + iVar5) * iVar5)) * dVar25;
        local_38 = local_38 + dVar15;
        dVar4 = dVar4 + 1.0;
        iVar5 = iVar5 + 1;
      } while (uVar10 + iVar5 != 0);
    }
    local_a0 = (dVar3 * dVar21) / (dVar26 * dVar19 * dVar17);
    uVar6 = 1;
    if (1 < (int)uVar12) {
      uVar6 = uVar12;
    }
    dVar24 = (-dVar24 * dVar21) / (dVar2 * dVar16 * local_128);
    dVar26 = 0.0;
    dVar19 = 1.0;
    uVar13 = uVar6;
    do {
      dVar26 = dVar26 + 1.0 / dVar19;
      dVar19 = dVar19 + 1.0;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
    dVar19 = log(dVar25);
    uVar13 = 1;
    dVar17 = 0.0;
    iVar5 = 2;
    dVar21 = 1.0;
    dVar26 = dVar19 + ((dVar1 + dVar20) - dVar26) + 1.1544313298030657;
    do {
      dVar19 = (double)(int)uVar13;
      dVar2 = b + dVar19 + -1.0;
      dVar16 = dVar18 + dVar19 + -1.0;
      dVar17 = (1.0 - dVar18) / (dVar19 * dVar16) + (1.0 - b) / (dVar2 * dVar19) + dVar17;
      dVar19 = 0.0;
      iVar11 = iVar5;
      uVar12 = uVar6;
      do {
        dVar19 = dVar19 + 1.0 / (double)iVar11;
        iVar11 = iVar11 + 1;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
      dVar3 = log(dVar25);
      dVar21 = ((dVar16 * dVar21 * dVar2) / (double)(int)((uVar13 - uVar10) * uVar13)) * dVar25;
      dVar2 = (dVar3 + ((dVar1 + dVar20 + 1.1544313298030657 + dVar17) - dVar19)) * dVar21 + dVar26;
      if (ABS(dVar2 - dVar26) < ABS(dVar2) * dVar22) goto LAB_001cc4f6;
      uVar13 = uVar13 + 1;
      iVar5 = iVar5 + 1;
      dVar26 = dVar2;
    } while (uVar13 != 0xfb);
    uVar13 = 0xfb;
  }
LAB_001cc4f6:
  dVar26 = local_38 * local_a0 + dVar24 * dVar2;
LAB_001cc527:
  if (x < 0.0) {
    dVar18 = pow(dVar23,a);
    dVar26 = dVar26 * (1.0 / dVar18);
  }
  if (uVar13 < 0x79) {
    return dVar26;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"R8_HYPER_2F1 - Warning!\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  A large number of iterations were needed.\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  The accuracy of the results should be checked.\n",0x31);
  return dVar26;
}

Assistant:

double r8_hyper_2f1 ( double a, double b, double c, double x )

//****************************************************************************80
//
//  Purpose:
//
//    R8_HYPER_2F1 evaluates the hypergeometric function F(A,B,C,X).
//
//  Discussion:
//
//    A minor bug was corrected.  The HW variable, used in several places as
//    the "old" value of a quantity being iteratively improved, was not
//    being initialized.  JVB, 11 February 2008.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 July 2009
//
//  Author:
//
//    Original FORTRAN77 original by Shanjie Zhang, Jianming Jin.
//    C++ version by John Burkardt.
//
//    The original FORTRAN77 version of this routine is copyrighted by
//    Shanjie Zhang and Jianming Jin.  However, they give permission to
//    incorporate this routine into a user program provided that the copyright
//    is acknowledged.
//
//  Reference:
//
//    Shanjie Zhang, Jianming Jin,
//    Computation of Special Functions,
//    Wiley, 1996,
//    ISBN: 0-471-11963-6,
//    LC: QA351.C45
//
//  Parameters:
//
//    Input, double A, B, C, X, the arguments of the function.
//    C must not be equal to a nonpositive integer.
//    X < 1.
//
//    Output, double R8_HYPER_2F1, the value of the function.
//
{
  double a0;
  double aa;
  double bb;
  double c0;
  double c1;
  double el = 0.5772156649015329;
  double eps;
  double f0;
  double f1;
  double g0;
  double g1;
  double g2;
  double g3;
  double ga;
  double gabc;
  double gam;
  double gb;
  double gbm;
  double gc;
  double gca;
  double gcab;
  double gcb;
  double gm;
  double hf;
  double hw;
  int j;
  int k;
  bool l0;
  bool l1;
  bool l2;
  bool l3;
  bool l4;
  bool l5;
  int m;
  int nm;
  double pa;
  double pb;
  const double r8_pi = 3.141592653589793;
  double r;
  double r0;
  double r1;
  double rm;
  double rp;
  double sm;
  double sp;
  double sp0;
  double x1;

  l0 = ( c == int( c ) ) && ( c < 0.0 );
  l1 = ( 1.0 - x < 1.0E-15 ) && ( c - a - b <= 0.0 );
  l2 = ( a == int( a ) ) && ( a < 0.0 );
  l3 = ( b == int( b ) ) && ( b < 0.0 );
  l4 = ( c - a == int( c - a ) ) && ( c - a <= 0.0 );
  l5 = ( c - b == int( c - b ) ) && ( c - b <= 0.0 );

  if ( l0 )
  {
    std::cerr << "\n";
    std::cerr << "R8_HYPER_2F1 - Fatal error!\n";
    std::cerr << "  The hypergeometric series is divergent.\n";
    std::cerr << "  C is integral and negative.\n";
    std::cerr << "  C = " << c << "\n";
    exit ( 1 );
  }

  if ( l1 )
  {
    std::cerr << "\n";
    std::cerr << "R8_HYPER_2F1 - Fatal error!\n";
    std::cerr << "  The hypergeometric series is divergent.\n";
    std::cerr << "  1 - X < 0, C - A - B <= 0\n";
    std::cerr << "  A = " << a << "\n";
    std::cerr << "  B = " << b << "\n";
    std::cerr << "  C = " << c << "\n";
    std::cerr << "  X = " << x << "\n";
    exit ( 1 );
  }

  if ( 0.95 < x )
  {
    eps = 1.0E-08;
  }
  else
  {
    eps = 1.0E-15;
  }

  if ( x == 0.0 || a == 0.0 || b == 0.0 )
  {
    hf = 1.0;
    return hf;
  }
  else if ( 1.0 - x == eps && 0.0 < c - a - b )
  {
    gc = tgamma ( c );
    gcab = tgamma ( c - a - b );
    gca = tgamma ( c - a );
    gcb = tgamma ( c - b );
    hf = gc * gcab / ( gca * gcb );
    return hf;
  }
  else if ( 1.0 + x <= eps && fabs ( c - a + b - 1.0 ) <= eps )
  {
    g0 = sqrt ( r8_pi ) * pow ( 2.0, - a );
    g1 = tgamma ( c );
    g2 = tgamma ( 1.0 + a / 2.0 - b );
    g3 = tgamma ( 0.5 + 0.5 * a );
    hf = g0 * g1 / ( g2 * g3 );
    return hf;
  }
  else if ( l2 || l3 )
  {
    if ( l2 )
    {
      nm = int( fabs ( a ) );
    }

    if ( l3 )
    {
      nm = int( fabs ( b ) );
    }

    hf = 1.0;
    r = 1.0;

    for ( k = 1; k <= nm; k++ )
    {
      r = r * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
        / ( k * ( c + k - 1.0 ) ) * x;
      hf = hf + r;
    }

    return hf;
  }
  else if ( l4 || l5 )
  {
    if ( l4 )
    {
      nm = int( fabs ( c - a ) );
    }

    if ( l5 )
    {
      nm = int( fabs ( c - b ) );
    }

    hf = 1.0;
    r  = 1.0;
    for ( k = 1; k <= nm; k++ )
    {
      r = r * ( c - a + k - 1.0 ) * ( c - b + k - 1.0 ) 
        / ( k * ( c + k - 1.0 ) ) * x;
      hf = hf + r;
    }
    hf = pow ( 1.0 - x, c - a - b ) * hf;
    return hf;
  }

  aa = a;
  bb = b;
  x1 = x;

  if ( x < 0.0 )
  {
    x = x / ( x - 1.0 );
    if ( a < c && b < a && 0.0 < b )
    {
      a = bb;
      b = aa;
    }
    b = c - b;
  }

  if ( 0.75 <= x )
  {
    gm = 0.0;

    if ( fabs ( c - a - b - int( c - a - b ) ) < 1.0E-15 )
    {
      m = int( c - a - b );
      ga = tgamma ( a );
      gb = tgamma ( b );
      gc = tgamma ( c );
      gam = tgamma ( a + m );
      gbm = tgamma ( b + m );

      pa = r8_psi ( a );
      pb = r8_psi ( b );

      if ( m != 0 )
      {
        gm = 1.0;
      }

      for ( j = 1; j <= std::abs ( m ) - 1; j++ )
      {
        gm = gm * j;
      }

      rm = 1.0;
      for ( j = 1; j <= std::abs ( m ); j++ )
      {
        rm = rm * j;
      }

      f0 = 1.0;
      r0 = 1.0;;
      r1 = 1.0;
      sp0 = 0.0;;
      sp = 0.0;

      if ( 0 <= m )
      {
        c0 = gm * gc / ( gam * gbm );
        c1 = - gc * pow ( x - 1.0, m ) / ( ga * gb * rm );

        for ( k = 1; k <= m - 1; k++ )
        {
          r0 = r0 * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
            / ( k * ( k - m ) ) * ( 1.0 - x );
          f0 = f0 + r0;
        }

        for ( k = 1; k <= m; k++ )
        {
          sp0 = sp0 + 1.0 / ( a + k - 1.0 ) + 1.0 / ( b + k - 1.0 ) 
          - 1.0 / double( k );
        }

        f1 = pa + pb + sp0 + 2.0 * el + log ( 1.0 - x );
        hw = f1;

        for ( k = 1; k <= 250; k++ )
        {
          sp = sp + ( 1.0 - a ) / ( k * ( a + k - 1.0 ) ) 
            + ( 1.0 - b ) / ( k * ( b + k - 1.0 ) );

          sm = 0.0;
          for ( j = 1; j <= m; j++ )
          {
            sm = sm + ( 1.0 - a ) 
              / ( ( j + k ) * ( a + j + k - 1.0 ) ) 
              + 1.0 / ( b + j + k - 1.0 );
          }

          rp = pa + pb + 2.0 * el + sp + sm + log ( 1.0 - x );

          r1 = r1 * ( a + m + k - 1.0 ) * ( b + m + k - 1.0 ) 
            / ( k * ( m + k ) ) * ( 1.0 - x );

          f1 = f1 + r1 * rp;

          if ( fabs ( f1 - hw ) < fabs ( f1 ) * eps )
          {
            break;
          }
          hw = f1;
        }
        hf = f0 * c0 + f1 * c1;
      }
      else if ( m < 0 )
      {
        m = - m;
        c0 = gm * gc / ( ga * gb * pow ( 1.0 - x, m ) );
        c1 = - pow ( - 1.0, m ) * gc / ( gam * gbm * rm );

        for ( k = 1; k <= m - 1; k++ )
        {
          r0 = r0 * ( a - m + k - 1.0 ) * ( b - m + k - 1.0 ) 
            / ( k * ( k - m ) ) * ( 1.0 - x );
          f0 = f0 + r0;
        }

        for ( k = 1; k <= m; k++ )
        {
          sp0 = sp0 + 1.0 / double( k );
        }

        f1 = pa + pb - sp0 + 2.0 * el + log ( 1.0 - x );
        hw = f1;

        for ( k = 1; k <= 250; k++ )
        {
          sp = sp + ( 1.0 - a ) 
            / ( k * ( a + k - 1.0 ) ) 
            + ( 1.0 - b ) / ( k * ( b + k - 1.0 ) );

          sm = 0.0;
          for ( j = 1; j <= m; j++ )
          {
            sm = sm + 1.0 / double( j + k );
          }

          rp = pa + pb + 2.0 * el + sp - sm + log ( 1.0 - x );

          r1 = r1 * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
            / ( k * ( m + k ) ) * ( 1.0 - x );

          f1 = f1 + r1 * rp;

          if ( fabs ( f1 - hw ) < fabs ( f1 ) * eps )
          {
            break;
          }

          hw = f1;
        }

        hf = f0 * c0 + f1 * c1;
      }
    }
    else
    {
      ga = tgamma ( a );
      gb = tgamma ( b );
      gc = tgamma ( c );
      gca = tgamma ( c - a );
      gcb = tgamma ( c - b );
      gcab = tgamma ( c - a - b );
      gabc = tgamma ( a + b - c );
      c0 = gc * gcab / ( gca * gcb );
      c1 = gc * gabc / ( ga * gb ) * pow ( 1.0 - x, c - a - b );
      hf = 0.0;
      hw = hf;
      r0 = c0;
      r1 = c1;

      for ( k = 1; k <= 250; k++ )
      {
        r0 = r0 * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
          / ( k * ( a + b - c + k ) ) * ( 1.0 - x );

        r1 = r1 * ( c - a + k - 1.0 ) * ( c - b + k - 1.0 ) 
          / ( k * ( c - a - b + k ) ) * ( 1.0 - x );

        hf = hf + r0 + r1;

        if ( fabs ( hf - hw ) < fabs ( hf ) * eps )
        {
          break;
        }
        hw = hf;
      }
      hf = hf + c0 + c1;
    }
  }
  else
  {
    a0 = 1.0;

    if ( a < c && c < 2.0 * a && b < c && c < 2.0 * b )
    {
      a0 = pow ( 1.0 - x, c - a - b );
      a = c - a;
      b = c - b;
    }

    hf = 1.0;
    hw = hf;
    r = 1.0;

    for ( k = 1; k <= 250; k++ )
    {
      r = r * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
        / ( k * ( c + k - 1.0 ) ) * x;

      hf = hf + r;

      if ( fabs ( hf - hw ) <= fabs ( hf ) * eps )
      {
        break;
      }

      hw = hf;
    }
    hf = a0 * hf;
  }

  if ( x1 < 0.0 )
  {
    x = x1;
    c0 = 1.0 / pow ( 1.0 - x, aa );
    hf = c0 * hf;
  }

  a = aa;
  b = bb;

  if ( 120 < k )
  {
    std::cout << "\n";
    std::cout << "R8_HYPER_2F1 - Warning!\n";
    std::cout << "  A large number of iterations were needed.\n";
    std::cout << "  The accuracy of the results should be checked.\n";
  }

  return hf;
}